

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O0

void __thiscall despot::FVRS::Step(FVRS *this)

{
  double *in_RCX;
  ACT_TYPE in_EDX;
  State *in_RSI;
  OBS_TYPE *in_R8;
  double in_XMM0_Qa;
  
  Step((FVRS *)&this[-1].super_BaseRockSample.transition_probabilities_.
                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_XMM0_Qa,in_EDX,in_RCX,
       in_R8);
  return;
}

Assistant:

bool FVRS::Step(State& state, double rand_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	RockSampleState& rockstate = static_cast<RockSampleState&>(state);
	reward = 0;

	if (action < E_SAMPLE) { // Move
		switch (action) {
		case Compass::EAST:
			if (GetX(&rockstate) + 1 < size_) {
				IncX(&rockstate);
				break;
			} else {
				reward = +10;
				return true;
			}

		case Compass::NORTH:
			if (GetY(&rockstate) + 1 < size_)
				IncY(&rockstate);
			else
				reward = -100;
			break;

		case Compass::SOUTH:
			if (GetY(&rockstate) - 1 >= 0)
				DecY(&rockstate);
			else
				reward = -100;
			break;

		case Compass::WEST:
			if (GetX(&rockstate) - 1 >= 0)
				DecX(&rockstate);
			else
				reward = -100;
			break;
		}
	}

	if (action == E_SAMPLE) { // Sample
		int rock = grid_(GetRobPosIndex(&rockstate));
		if (rock >= 0) {
			if (GetRock(&rockstate, rock))
				reward = +10;
			else
				reward = -10;
			SampleRock(&rockstate, rock);
		} else {
			reward = -100;
		}
	}

	obs = GetObservation(rand_num, rockstate);

	// assert(reward != -100);
	return false;
}